

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O1

void __thiscall
StackString<32UL,_char>::ReallocateBuffer(StackString<32UL,_char> *this,SIZE_T count)

{
  char *pcVar1;
  long lVar2;
  size_t szSize;
  
  szSize = count + 1;
  pcVar1 = (char *)PAL_malloc(szSize);
  if (pcVar1 == (char *)0x0) {
    SetLastError(8);
    if ((StackString<32UL,_char> *)this->m_buffer != this) {
      PAL_free((StackString<32UL,_char> *)this->m_buffer);
    }
    this->m_buffer = (char *)0x0;
    lVar2 = 0x38;
    szSize = 0;
  }
  else {
    if ((StackString<32UL,_char> *)this->m_buffer != this) {
      PAL_free((StackString<32UL,_char> *)this->m_buffer);
    }
    this->m_buffer = pcVar1;
    this->m_count = count;
    lVar2 = 0x30;
  }
  *(size_t *)(this->m_innerBuffer + lVar2) = szSize;
  return;
}

Assistant:

void ReallocateBuffer(SIZE_T count)
    {
        // count is always > STACKCOUNT here.
        T * newBuffer = (T *)PAL_malloc((count + 1) * sizeof(T));
        if (NULL == newBuffer)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);

            DeleteBuffer();
            m_count = 0;

            return;
        }

        DeleteBuffer();
        m_buffer = newBuffer;
        m_count = count;
        m_size = count+1;

        return;
    }